

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_setreturns(FuncState *fs,expdesc *e,int nresults)

{
  int nresults_local;
  expdesc *e_local;
  FuncState *fs_local;
  
  if (e->k == VCALL) {
    fs->f->code[(e->u).info] =
         fs->f->code[(e->u).info] & 0xff803fff | (nresults + 1U & 0x1ff) << 0xe;
  }
  else if (e->k == VVARARG) {
    fs->f->code[(e->u).info] = fs->f->code[(e->u).info] & 0x7fffff | (nresults + 1) * 0x800000;
    fs->f->code[(e->u).info] = fs->f->code[(e->u).info] & 0xffffc03f | (uint)fs->freereg << 6;
    luaK_reserveregs(fs,1);
  }
  return;
}

Assistant:

void luaK_setreturns (FuncState *fs, expdesc *e, int nresults) {
  if (e->k == VCALL) {  /* expression is an open function call? */
    SETARG_C(getcode(fs, e), nresults+1);
  }
  else if (e->k == VVARARG) {
    SETARG_B(getcode(fs, e), nresults+1);
    SETARG_A(getcode(fs, e), fs->freereg);
    luaK_reserveregs(fs, 1);
  }
}